

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addressOperations.cpp
# Opt level: O0

string * gmlc::networking::addProtocol(string *networkAddress,InterfaceTypes interfaceT)

{
  size_type sVar1;
  undefined1 in_DL;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  size_type in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_99;
  allocator<char> local_71 [56];
  allocator<char> local_39 [40];
  undefined1 local_11;
  
  local_11 = in_DL;
  sVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  if (sVar1 == 0xffffffffffffffff) {
    switch(local_11) {
    case 0:
    case 2:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38,
                 (allocator<char> *)in_RDI);
      std::operator+(in_stack_ffffffffffffff08,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffff00);
      std::__cxx11::string::~string(in_stack_ffffffffffffff00);
      std::allocator<char>::~allocator(local_39);
      break;
    case 1:
      pbVar2 = &local_99;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38,
                 (allocator<char> *)in_RDI);
      std::operator+(pbVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffff00);
      std::__cxx11::string::~string(in_stack_ffffffffffffff00);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
      break;
    case 3:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38,
                 (allocator<char> *)in_RDI);
      std::operator+(in_stack_ffffffffffffff08,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffff00);
      std::__cxx11::string::~string(in_stack_ffffffffffffff00);
      std::allocator<char>::~allocator(local_71);
      break;
    case 4:
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffff3f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38,
                 (allocator<char> *)in_RDI);
      std::operator+(in_stack_ffffffffffffff08,pbVar2);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pbVar2);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff3f);
      break;
    default:
      goto switchD_00732ea9_default;
    }
  }
  else {
switchD_00732ea9_default:
    std::__cxx11::string::string(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  return in_RDI;
}

Assistant:

std::string
    addProtocol(const std::string& networkAddress, InterfaceTypes interfaceT)
{
    if (networkAddress.find("://") == std::string::npos) {
        switch (interfaceT) {
            case InterfaceTypes::IP:
            case InterfaceTypes::TCP:
                return std::string("tcp://") + networkAddress;
            case InterfaceTypes::IPC:
                return std::string("ipc://") + networkAddress;
            case InterfaceTypes::UDP:
                return std::string("udp://") + networkAddress;
            case InterfaceTypes::INPROC:
                return std::string("inproc://") + networkAddress;
        }
    }
    return networkAddress;
}